

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Call::~Call(Call *this)

{
  ~Call((Call *)&this[-1].args.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}